

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::readEditFaceData(PtexReader *this)

{
  bool bVar1;
  reference this_00;
  EditFaceDataHeader *pEVar2;
  reference pvVar3;
  FilePos FVar4;
  PtexReader *in_RDI;
  FaceEdit *e;
  uint8_t *constdata;
  FaceInfo *f;
  int faceid;
  EditFaceDataHeader efdh;
  value_type *__x;
  EditFaceDataHeader *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffb0;
  PtexReader *in_stack_ffffffffffffffb8;
  int local_24;
  undefined8 local_20;
  undefined8 local_18;
  int32_t local_10;
  uint32_t local_c;
  
  EditFaceDataHeader::EditFaceDataHeader(in_stack_ffffffffffffffa0);
  bVar1 = readBlock(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20)
                    ,SUB81((ulong)in_RDI >> 0x18,0));
  if (((bVar1) && (-1 < local_24)) && ((ulong)(long)local_24 < (ulong)(in_RDI->_header).nfaces)) {
    this_00 = std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::operator[]
                        (&in_RDI->_faceinfo,(long)local_24);
    (this_00->res).ulog2 = (undefined1)local_20;
    (this_00->res).vlog2 = local_20._1_1_;
    this_00->adjedges = local_20._2_1_;
    this_00->flags = local_20._3_1_;
    this_00->adjfaces[0] = local_20._4_4_;
    *(undefined8 *)(this_00->adjfaces + 1) = local_18;
    this_00->adjfaces[3] = local_10;
    this_00->flags = this_00->flags | 2;
    pEVar2 = (EditFaceDataHeader *)(in_RDI->_constdata + in_RDI->_pixelsize * local_24);
    bVar1 = readBlock(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    if (bVar1) {
      if (((in_RDI->_premultiply & 1U) != 0) && (bVar1 = Header::hasAlpha(&in_RDI->_header), bVar1))
      {
        datatype(in_RDI);
        PtexUtils::multalpha
                  (in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20),(DataType)in_RDI,
                   (int)((ulong)pEVar2 >> 0x20),(int)pEVar2);
        in_stack_ffffffffffffffa0 = pEVar2;
      }
      bVar1 = FaceInfo::isConstant(this_00);
      if (!bVar1) {
        __x = (value_type *)&in_RDI->_faceedits;
        memset(&stack0xffffffffffffffb8,0,0x10);
        FaceEdit::FaceEdit((FaceEdit *)0x135aa1);
        std::
        vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
        ::push_back((vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                     *)in_stack_ffffffffffffffa0,__x);
        pvVar3 = std::
                 vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                 ::back((vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                         *)in_stack_ffffffffffffffa0);
        FVar4 = tell(in_RDI);
        pvVar3->pos = FVar4;
        pvVar3->faceid = local_24;
        (pvVar3->fdh).data = local_c;
      }
    }
  }
  return;
}

Assistant:

void PtexReader::readEditFaceData()
{
    // read header
    EditFaceDataHeader efdh;
    if (!readBlock(&efdh, EditFaceDataHeaderSize)) return;

    // update face info
    int faceid = efdh.faceid;
    if (faceid < 0 || size_t(faceid) >= _header.nfaces) return;
    FaceInfo& f = _faceinfo[faceid];
    f = efdh.faceinfo;
    f.flags |= FaceInfo::flag_hasedits;

    // read const value now
    uint8_t* constdata = _constdata + _pixelsize * faceid;
    if (!readBlock(constdata, _pixelsize)) return;
    if (_premultiply && _header.hasAlpha())
        PtexUtils::multalpha(constdata, 1, datatype(),
                             _header.nchannels, _header.alphachan);

    // update header info for remaining data
    if (!f.isConstant()) {
        _faceedits.push_back(FaceEdit());
        FaceEdit& e = _faceedits.back();
        e.pos = tell();
        e.faceid = faceid;
        e.fdh = efdh.fdh;
    }
}